

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

bool __thiscall
MemoryManager::setInt(MemoryManager *this,uint32_t addr,uint32_t val,uint32_t *cycles)

{
  if ((this->memory[addr >> 0x16] != (uint8_t **)0x0) &&
     (this->memory[addr >> 0x16][addr >> 0xc & 0x3ff] != (uint8_t *)0x0)) {
    setByte(this,addr,(uint8_t)val,cycles);
    setByte(this,addr + 1,(uint8_t)(val >> 8),(uint32_t *)0x0);
    setByte(this,addr + 2,(uint8_t)(val >> 0x10),(uint32_t *)0x0);
    setByte(this,addr + 3,(uint8_t)(val >> 0x18),(uint32_t *)0x0);
    return true;
  }
  printf("Memory write to invalid addr 0x%x!\n",(ulong)addr);
  exit(-1);
}

Assistant:

bool MemoryManager::setInt(uint32_t addr, uint32_t val, uint32_t *cycles) {
//    return setNByte(addr, 4, &val, cycles);
    if (!this->addrExist(addr)) {
        printf("Memory write to invalid addr 0x%x!\n", addr);
        exit(-1);
    }
    this->setByte(addr, val & 0xff, cycles);
    this->setByte(addr + 1, (val >> 8u) & 0xff);
    this->setByte(addr + 2, (val >> 16u) & 0xff);
    this->setByte(addr + 3, (val >> 24u) & 0xff);
    return true;
}